

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgt.cpp
# Opt level: O0

bool ReadMGT(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int iVar2;
  ulong extraout_RAX;
  pointer p;
  byte *pbVar3;
  reference pvVar4;
  string *path;
  element_type *peVar5;
  Data *data;
  FILE *pFVar6;
  char *local_308;
  byte local_2d3;
  bool local_2d1;
  bool local_2ce;
  Format local_2cc;
  undefined4 local_290;
  byte local_28b;
  byte local_28a;
  allocator<char> local_289;
  undefined1 local_288 [35];
  bool local_265;
  uint local_264;
  bool img;
  bool mgt;
  int offset;
  array<unsigned_char,_2UL> buf;
  undefined1 local_250 [8];
  MGT_DISK_INFO di;
  array<unsigned_char,_512UL> sector0;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  pFVar6 = (FILE *)disk;
  iVar2 = MemFile::size(file);
  if (iVar2 == 0xc8000) {
    MemFile::rewind(file,pFVar6);
    if (((extraout_RAX & 1) == 0) ||
       (bVar1 = MemFile::read<std::array<unsigned_char,512ul>>
                          (file,(array<unsigned_char,_512UL> *)&di.serial_number), !bVar1)) {
      file_local._7_1_ = false;
    }
    else {
      local_250._0_4_ = SAMDOS;
      local_250._4_4_ = 4;
      std::__cxx11::string::string((string *)&di);
      di.disk_label.field_2._8_4_ = 0;
      p = std::array<unsigned_char,_512UL>::data((array<unsigned_char,_512UL> *)&di.serial_number);
      GetDiskInfo(p,(MGT_DISK_INFO *)local_250);
      local_264 = local_250._4_4_ * 0x2800 + 0x1fe;
      bVar1 = MemFile::seek(file,local_264);
      local_2ce = false;
      if (bVar1) {
        bVar1 = MemFile::read<std::array<unsigned_char,2ul>>(file,(array<unsigned_char,_2UL> *)&img)
        ;
        local_2ce = false;
        if (bVar1) {
          pbVar3 = std::array<unsigned_char,_2UL>::operator[]((array<unsigned_char,_2UL> *)&img,0);
          local_2ce = false;
          if ((uint)*pbVar3 == local_250._4_4_) {
            pvVar4 = std::array<unsigned_char,_2UL>::operator[]((array<unsigned_char,_2UL> *)&img,1)
            ;
            local_2ce = *pvVar4 == '\x02';
          }
        }
      }
      local_265 = local_2ce;
      local_264 = local_250._4_4_ * 0x1400 + 0x1fe;
      pFVar6 = (FILE *)(ulong)local_264;
      bVar1 = MemFile::seek(file,local_264);
      local_2d1 = false;
      if (bVar1) {
        pFVar6 = (FILE *)&img;
        bVar1 = MemFile::read<std::array<unsigned_char,2ul>>
                          (file,(array<unsigned_char,_2UL> *)pFVar6);
        local_2d1 = false;
        if (bVar1) {
          pFVar6 = (FILE *)0x0;
          pbVar3 = std::array<unsigned_char,_2UL>::operator[]((array<unsigned_char,_2UL> *)&img,0);
          local_2d1 = false;
          if ((uint)*pbVar3 == local_250._4_4_) {
            pFVar6 = (FILE *)0x1;
            pvVar4 = std::array<unsigned_char,_2UL>::operator[]((array<unsigned_char,_2UL> *)&img,1)
            ;
            local_2d1 = *pvVar4 == '\x02';
          }
        }
      }
      local_288[0x22] = local_2d1;
      local_28a = 0;
      local_28b = 0;
      local_2d3 = 0;
      if (((local_265 & 1U) == 0) && (local_2d3 = 0, local_2d1 == false)) {
        path = MemFile::name_abi_cxx11_(file);
        std::allocator<char>::allocator();
        local_28a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_288,"mgt",&local_289);
        local_28b = 1;
        pFVar6 = (FILE *)local_288;
        bVar1 = IsFileExt(path,(string *)pFVar6);
        local_2d3 = bVar1 ^ 0xff;
      }
      if ((local_28b & 1) != 0) {
        std::__cxx11::string::~string((string *)local_288);
      }
      if ((local_28a & 1) != 0) {
        std::allocator<char>::~allocator(&local_289);
      }
      if ((local_2d3 & 1) == 0) {
        MemFile::rewind(file,pFVar6);
        peVar5 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        Format::Format(&local_2cc,MGT);
        data = MemFile::data(file);
        Disk::format(peVar5,&local_2cc,data,(bool)(local_288[0x22] & 1));
        if ((local_288[0x22] & 1) == 0) {
          local_308 = "MGT";
        }
        else {
          local_308 = "IMG";
        }
        peVar5 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        std::__cxx11::string::operator=((string *)&peVar5->strType,local_308);
        file_local._7_1_ = true;
      }
      else {
        file_local._7_1_ = false;
      }
      local_290 = 1;
      MGT_DISK_INFO::~MGT_DISK_INFO((MGT_DISK_INFO *)local_250);
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadMGT(MemFile& file, std::shared_ptr<Disk>& disk)
{
    if (file.size() != MGT_DISK_SIZE)
        return false;

    // Read the first sector, which contains disk information.
    std::array<uint8_t, SECTOR_SIZE> sector0;
    if (!file.rewind() || !file.read(sector0))
        return false;

    MGT_DISK_INFO di{};
    GetDiskInfo(sector0.data(), di);

    // Check the expected chain offset in MGT images (alternating sides).
    std::array<uint8_t, 2> buf;
    auto offset = (di.dir_tracks * MGT_SIDES * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool mgt = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // Check the expected chain offset in IMG images (side 0 then side 1).
    offset = (di.dir_tracks * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool img = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // If neither signature matched this probably isn't an MGT file.
    // However, accept it if it has a .mgt file extension.
    if (!mgt && !img && !IsFileExt(file.name(), "mgt"))
        return false;

    file.rewind();
    disk->format(Format(RegularFormat::MGT), file.data(), img);
    disk->strType = img ? "IMG" : "MGT";

    return true;
}